

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateDynamic(ucvector *out,size_t *bp,Hash *hash,uchar *data,size_t datapos,size_t dataend,
                   LodePNGCompressSettings *settings,uint final)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RCX;
  uint uVar5;
  ulong *in_RSI;
  long *in_RDI;
  ulong in_R8;
  ulong in_R9;
  bool bVar6;
  long in_stack_00000008;
  int in_stack_00000010;
  uint rest;
  uint num;
  size_t k;
  uint j;
  uint dist;
  uint symbol;
  uint HCLEN;
  uint HDIST;
  uint HLIT;
  size_t i;
  size_t numcodes_d;
  size_t numcodes_ll;
  uint BFINAL;
  size_t datasize;
  uivector bitlen_cl;
  uivector bitlen_lld_e;
  uivector bitlen_lld;
  uivector frequencies_cl;
  uivector frequencies_d;
  uivector frequencies_ll;
  HuffmanTree tree_cl;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  uivector lz77_encoded;
  uint error;
  undefined4 in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  size_t *in_stack_fffffffffffffe40;
  HuffmanTree *in_stack_fffffffffffffe48;
  ulong local_188;
  uint in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  uint in_stack_fffffffffffffe88;
  size_t sVar7;
  ulong uVar8;
  size_t *psVar9;
  Hash *pHVar10;
  size_t *bp_00;
  ulong local_158;
  undefined4 local_140;
  uint in_stack_fffffffffffffec4;
  size_t in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  uint *in_stack_fffffffffffffed8;
  Hash *in_stack_fffffffffffffee0;
  uivector *in_stack_fffffffffffffee8;
  uint *local_110;
  ulong local_108;
  uint in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff08;
  undefined4 uStack_f4;
  uint in_stack_ffffffffffffff10;
  uivector local_e0;
  uivector local_c8;
  HuffmanTree local_b0;
  HuffmanTree local_90;
  HuffmanTree local_70;
  uivector local_50;
  uint local_34;
  ulong local_30;
  ulong local_28;
  long local_20;
  ulong *local_10;
  long *local_8;
  
  local_34 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uivector_init(&local_50);
  HuffmanTree_init(&local_70);
  HuffmanTree_init(&local_90);
  HuffmanTree_init(&local_b0);
  uivector_init(&local_c8);
  uivector_init(&local_e0);
  uivector_init((uivector *)&stack0xffffffffffffff08);
  uivector_init((uivector *)&local_110);
  uivector_init((uivector *)&stack0xfffffffffffffed8);
  uivector_init((uivector *)&local_140);
  if (local_34 == 0) {
    if (*(int *)(in_stack_00000008 + 4) == 0) {
      uVar1 = uivector_resize((uivector *)
                              CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0x99405a
                             );
      uVar8 = local_28;
      if (uVar1 == 0) {
        local_34 = 0x53;
        goto LAB_00994beb;
      }
      for (; uVar8 < local_30; uVar8 = uVar8 + 1) {
        local_50.data[uVar8 - local_28] = (uint)*(byte *)(local_20 + uVar8);
      }
    }
    else {
      in_stack_fffffffffffffe28 = *(undefined4 *)(in_stack_00000008 + 0xc);
      in_stack_fffffffffffffe30 = *(undefined4 *)(in_stack_00000008 + 0x10);
      in_stack_fffffffffffffe38 = *(undefined4 *)(in_stack_00000008 + 0x14);
      local_34 = encodeLZ77(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                            (uchar *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                            in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                            in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff10);
      if (local_34 != 0) goto LAB_00994beb;
      local_34 = 0;
    }
    uVar1 = uivector_resizev((uivector *)in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40
                             ,in_stack_fffffffffffffe3c);
    if (uVar1 == 0) {
      local_34 = 0x53;
    }
    else {
      uVar1 = uivector_resizev((uivector *)in_stack_fffffffffffffe48,
                               (size_t)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      if (uVar1 == 0) {
        local_34 = 0x53;
      }
      else {
        for (sVar7 = 0; sVar7 != local_50.size; sVar7 = sVar7 + 1) {
          in_stack_fffffffffffffe88 = local_50.data[sVar7];
          local_c8.data[in_stack_fffffffffffffe88] = local_c8.data[in_stack_fffffffffffffe88] + 1;
          if (0x100 < in_stack_fffffffffffffe88) {
            in_stack_fffffffffffffe84 = local_50.data[sVar7 + 2];
            local_e0.data[in_stack_fffffffffffffe84] = local_e0.data[in_stack_fffffffffffffe84] + 1;
            sVar7 = sVar7 + 3;
          }
        }
        local_c8.data[0x100] = 1;
        local_34 = HuffmanTree_makeFromFrequencies
                             (in_stack_fffffffffffffe48,(uint *)in_stack_fffffffffffffe40,
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                              in_stack_fffffffffffffe2c);
        if ((local_34 == 0) &&
           (local_34 = HuffmanTree_makeFromFrequencies
                                 (in_stack_fffffffffffffe48,(uint *)in_stack_fffffffffffffe40,
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                  CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                  in_stack_fffffffffffffe2c), local_34 == 0)) {
          local_158 = (ulong)local_70.numcodes;
          if (0x11e < local_158) {
            local_158 = 0x11e;
          }
          bp_00 = (size_t *)(ulong)local_90.numcodes;
          if ((size_t *)0x1e < bp_00) {
            bp_00 = (size_t *)0x1e;
          }
          local_34 = 0;
          for (uVar8 = 0; uVar8 != local_158; uVar8 = uVar8 + 1) {
            HuffmanTree_getLength(&local_70,(uint)uVar8);
            uivector_push_back((uivector *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
          }
          for (psVar9 = (size_t *)0x0; psVar9 != bp_00; psVar9 = (size_t *)((long)psVar9 + 1)) {
            HuffmanTree_getLength(&local_90,(uint)psVar9);
            uivector_push_back((uivector *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
          }
          for (uVar8 = 0; uVar8 != (local_108 & 0xffffffff); uVar8 = uVar8 + 1) {
            in_stack_fffffffffffffe80 = 0;
            while( true ) {
              bVar6 = false;
              if (uVar8 + in_stack_fffffffffffffe80 + 1 < (local_108 & 0xffffffff)) {
                bVar6 = local_110[uVar8 + in_stack_fffffffffffffe80 + 1] == local_110[uVar8];
              }
              if (!bVar6) break;
              in_stack_fffffffffffffe80 = in_stack_fffffffffffffe80 + 1;
            }
            if ((local_110[uVar8] == 0) && (1 < in_stack_fffffffffffffe80)) {
              in_stack_fffffffffffffe80 = in_stack_fffffffffffffe80 + 1;
              if (in_stack_fffffffffffffe80 < 0xb) {
                uivector_push_back((uivector *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
                uivector_push_back((uivector *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
              }
              else {
                if (0x8a < in_stack_fffffffffffffe80) {
                  in_stack_fffffffffffffe80 = 0x8a;
                }
                uivector_push_back((uivector *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
                uivector_push_back((uivector *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
              }
              uVar8 = (in_stack_fffffffffffffe80 - 1) + uVar8;
            }
            else if (in_stack_fffffffffffffe80 < 3) {
              uivector_push_back((uivector *)
                                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
            }
            else {
              uVar1 = in_stack_fffffffffffffe80 / 6;
              uVar5 = in_stack_fffffffffffffe80 % 6;
              uivector_push_back((uivector *)
                                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
              for (local_188 = 0; local_188 < uVar1; local_188 = local_188 + 1) {
                uivector_push_back((uivector *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
                uivector_push_back((uivector *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
              }
              if (uVar5 < 3) {
                in_stack_fffffffffffffe80 = in_stack_fffffffffffffe80 - uVar5;
              }
              else {
                uivector_push_back((uivector *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
                uivector_push_back((uivector *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0);
              }
              uVar8 = in_stack_fffffffffffffe80 + uVar8;
            }
          }
          uVar1 = uivector_resizev((uivector *)in_stack_fffffffffffffe48,
                                   (size_t)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
          if (uVar1 == 0) {
            local_34 = 0x53;
          }
          else {
            for (pHVar10 = (Hash *)0x0; pHVar10 != in_stack_fffffffffffffee0;
                pHVar10 = (Hash *)((long)&pHVar10->head + 1)) {
              *(int *)(CONCAT44(uStack_f4,in_stack_ffffffffffffff08) +
                      (ulong)in_stack_fffffffffffffed8[(long)pHVar10] * 4) =
                   *(int *)(CONCAT44(uStack_f4,in_stack_ffffffffffffff08) +
                           (ulong)in_stack_fffffffffffffed8[(long)pHVar10] * 4) + 1;
              if (0xf < in_stack_fffffffffffffed8[(long)pHVar10]) {
                pHVar10 = (Hash *)((long)&pHVar10->head + 1);
              }
            }
            local_34 = HuffmanTree_makeFromFrequencies
                                 (in_stack_fffffffffffffe48,(uint *)in_stack_fffffffffffffe40,
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                  CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                  in_stack_fffffffffffffe2c);
            if (local_34 == 0) {
              uVar1 = uivector_resize((uivector *)
                                      CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                      0x99465f);
              if (uVar1 == 0) {
                local_34 = 0x53;
              }
              else {
                for (uVar8 = 0; uVar8 != local_b0.numcodes; uVar8 = uVar8 + 1) {
                  uVar1 = HuffmanTree_getLength(&local_b0,CLCL_ORDER[uVar8]);
                  *(uint *)(CONCAT44(in_stack_fffffffffffffec4,local_140) + uVar8 * 4) = uVar1;
                }
                do {
                  if (*(int *)(CONCAT44(in_stack_fffffffffffffec4,local_140) +
                              (in_stack_fffffffffffffec8 - 1) * 4) != 0 ||
                      in_stack_fffffffffffffec8 < 5) goto LAB_00994735;
                  uVar1 = uivector_resize((uivector *)
                                          CONCAT44(in_stack_fffffffffffffe2c,
                                                   in_stack_fffffffffffffe28),0x994721);
                } while (uVar1 != 0);
                local_34 = 0x53;
LAB_00994735:
                iVar4 = (int)in_stack_fffffffffffffec8;
                if (local_34 == 0) {
                  if ((*local_10 & 7) == 0) {
                    ucvector_push_back((ucvector *)
                                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                                       ,'\0');
                  }
                  *(byte *)(*local_8 + local_8[1] + -1) =
                       *(byte *)(*local_8 + local_8[1] + -1) |
                       (byte)(in_stack_00000010 << ((byte)*local_10 & 7));
                  *local_10 = *local_10 + 1;
                  if ((*local_10 & 7) == 0) {
                    ucvector_push_back((ucvector *)
                                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                                       ,'\0');
                  }
                  *(byte *)(*local_8 + local_8[1] + -1) =
                       *(byte *)(*local_8 + local_8[1] + -1) | (byte)(0 << ((byte)*local_10 & 7));
                  *local_10 = *local_10 + 1;
                  if ((*local_10 & 7) == 0) {
                    ucvector_push_back((ucvector *)
                                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                                       ,'\0');
                  }
                  *(byte *)(*local_8 + local_8[1] + -1) =
                       *(byte *)(*local_8 + local_8[1] + -1) | (byte)(1 << ((byte)*local_10 & 7));
                  *local_10 = *local_10 + 1;
                  iVar2 = (int)local_158 + -0x101;
                  iVar3 = (int)bp_00 + -1;
                  for (iVar4 = iVar4 + -4;
                      *(int *)(CONCAT44(in_stack_fffffffffffffec4,local_140) +
                              (ulong)(iVar4 + 3) * 4) == 0 && iVar4 != 0; iVar4 = iVar4 + -1) {
                  }
                  addBitsToStream(in_stack_fffffffffffffe40,
                                  (ucvector *)
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                  in_stack_fffffffffffffe34,
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
                  addBitsToStream(in_stack_fffffffffffffe40,
                                  (ucvector *)
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                  in_stack_fffffffffffffe34,
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
                  addBitsToStream(in_stack_fffffffffffffe40,
                                  (ucvector *)
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                  in_stack_fffffffffffffe34,
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
                  for (uVar8 = 0; uVar8 != iVar4 + 4; uVar8 = uVar8 + 1) {
                    addBitsToStream(in_stack_fffffffffffffe40,
                                    (ucvector *)
                                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                    in_stack_fffffffffffffe34,
                                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
                  }
                  for (pHVar10 = (Hash *)0x0; pHVar10 != in_stack_fffffffffffffee0;
                      pHVar10 = (Hash *)((long)&pHVar10->head + 1)) {
                    HuffmanTree_getCode(&local_b0,in_stack_fffffffffffffed8[(long)pHVar10]);
                    HuffmanTree_getLength(&local_b0,in_stack_fffffffffffffed8[(long)pHVar10]);
                    addHuffmanSymbol((size_t *)
                                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                     (ucvector *)
                                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0
                                     ,0x994a45);
                    if (in_stack_fffffffffffffed8[(long)pHVar10] == 0x10) {
                      pHVar10 = (Hash *)((long)&pHVar10->head + 1);
                      addBitsToStream(in_stack_fffffffffffffe40,
                                      (ucvector *)
                                      CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                      in_stack_fffffffffffffe34,
                                      CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
                      ;
                    }
                    else if (in_stack_fffffffffffffed8[(long)pHVar10] == 0x11) {
                      pHVar10 = (Hash *)((long)&pHVar10->head + 1);
                      addBitsToStream(in_stack_fffffffffffffe40,
                                      (ucvector *)
                                      CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                      in_stack_fffffffffffffe34,
                                      CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
                      ;
                    }
                    else if (in_stack_fffffffffffffed8[(long)pHVar10] == 0x12) {
                      pHVar10 = (Hash *)((long)&pHVar10->head + 1);
                      addBitsToStream(in_stack_fffffffffffffe40,
                                      (ucvector *)
                                      CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                      in_stack_fffffffffffffe34,
                                      CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
                      ;
                    }
                  }
                  writeLZ77data(bp_00,(ucvector *)pHVar10,(uivector *)CONCAT44(iVar2,iVar3),
                                (HuffmanTree *)CONCAT44(iVar4,in_stack_fffffffffffffe88),
                                (HuffmanTree *)
                                CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
                  uVar1 = HuffmanTree_getLength(&local_70,0x100);
                  if (uVar1 == 0) {
                    local_34 = 0x40;
                  }
                  else {
                    HuffmanTree_getCode(&local_70,0x100);
                    HuffmanTree_getLength(&local_70,0x100);
                    addHuffmanSymbol((size_t *)
                                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                     (ucvector *)
                                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0
                                     ,0x994beb);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00994beb:
  uivector_cleanup((void *)0x994bf8);
  HuffmanTree_cleanup((HuffmanTree *)0x994c05);
  HuffmanTree_cleanup((HuffmanTree *)0x994c12);
  HuffmanTree_cleanup((HuffmanTree *)0x994c1f);
  uivector_cleanup((void *)0x994c2c);
  uivector_cleanup((void *)0x994c39);
  uivector_cleanup((void *)0x994c46);
  uivector_cleanup((void *)0x994c53);
  uivector_cleanup((void *)0x994c60);
  uivector_cleanup((void *)0x994c6d);
  return local_34;
}

Assistant:

static unsigned deflateDynamic(ucvector* out, size_t* bp, Hash* hash,
                               const unsigned char* data, size_t datapos, size_t dataend,
                               const LodePNGCompressSettings* settings, unsigned final)
{
  unsigned error = 0;

  /*
  A block is compressed as follows: The PNG data is lz77 encoded, resulting in
  literal bytes and length/distance pairs. This is then huffman compressed with
  two huffman trees. One huffman tree is used for the lit and len values ("ll"),
  another huffman tree is used for the dist values ("d"). These two trees are
  stored using their code lengths, and to compress even more these code lengths
  are also run-length encoded and huffman compressed. This gives a huffman tree
  of code lengths "cl". The code lenghts used to describe this third tree are
  the code length code lengths ("clcl").
  */

  /*The lz77 encoded data, represented with integers since there will also be length and distance codes in it*/
  uivector lz77_encoded;
  HuffmanTree tree_ll; /*tree for lit,len values*/
  HuffmanTree tree_d; /*tree for distance codes*/
  HuffmanTree tree_cl; /*tree for encoding the code lengths representing tree_ll and tree_d*/
  uivector frequencies_ll; /*frequency of lit,len codes*/
  uivector frequencies_d; /*frequency of dist codes*/
  uivector frequencies_cl; /*frequency of code length codes*/
  uivector bitlen_lld; /*lit,len,dist code lenghts (int bits), literally (without repeat codes).*/
  uivector bitlen_lld_e; /*bitlen_lld encoded with repeat codes (this is a rudemtary run length compression)*/
  /*bitlen_cl is the code length code lengths ("clcl"). The bit lengths of codes to represent tree_cl
  (these are written as is in the file, it would be crazy to compress these using yet another huffman
  tree that needs to be represented by yet another set of code lengths)*/
  uivector bitlen_cl;
  size_t datasize = dataend - datapos;

  /*
  Due to the huffman compression of huffman tree representations ("two levels"), there are some anologies:
  bitlen_lld is to tree_cl what data is to tree_ll and tree_d.
  bitlen_lld_e is to bitlen_lld what lz77_encoded is to data.
  bitlen_cl is to bitlen_lld_e what bitlen_lld is to lz77_encoded.
  */

  unsigned BFINAL = final;
  size_t numcodes_ll, numcodes_d, i;
  unsigned HLIT, HDIST, HCLEN;

  uivector_init(&lz77_encoded);
  HuffmanTree_init(&tree_ll);
  HuffmanTree_init(&tree_d);
  HuffmanTree_init(&tree_cl);
  uivector_init(&frequencies_ll);
  uivector_init(&frequencies_d);
  uivector_init(&frequencies_cl);
  uivector_init(&bitlen_lld);
  uivector_init(&bitlen_lld_e);
  uivector_init(&bitlen_cl);

  /*This while loop never loops due to a break at the end, it is here to
  allow breaking out of it to the cleanup phase on error conditions.*/
  while(!error)
  {
    if(settings->use_lz77)
    {
      error = encodeLZ77(&lz77_encoded, hash, data, datapos, dataend, settings->windowsize,
                         settings->minmatch, settings->nicematch, settings->lazymatching);
      if(error) break;
    }
    else
    {
      if(!uivector_resize(&lz77_encoded, datasize)) ERROR_BREAK(83 /*alloc fail*/);
      for(i = datapos; i < dataend; ++i) lz77_encoded.data[i - datapos] = data[i]; /*no LZ77, but still will be Huffman compressed*/
    }

    if(!uivector_resizev(&frequencies_ll, 286, 0)) ERROR_BREAK(83 /*alloc fail*/);
    if(!uivector_resizev(&frequencies_d, 30, 0)) ERROR_BREAK(83 /*alloc fail*/);

    /*Count the frequencies of lit, len and dist codes*/
    for(i = 0; i != lz77_encoded.size; ++i)
    {
      unsigned symbol = lz77_encoded.data[i];
      ++frequencies_ll.data[symbol];
      if(symbol > 256)
      {
        unsigned dist = lz77_encoded.data[i + 2];
        ++frequencies_d.data[dist];
        i += 3;
      }
    }
    frequencies_ll.data[256] = 1; /*there will be exactly 1 end code, at the end of the block*/

    /*Make both huffman trees, one for the lit and len codes, one for the dist codes*/
    error = HuffmanTree_makeFromFrequencies(&tree_ll, frequencies_ll.data, 257, frequencies_ll.size, 15);
    if(error) break;
    /*2, not 1, is chosen for mincodes: some buggy PNG decoders require at least 2 symbols in the dist tree*/
    error = HuffmanTree_makeFromFrequencies(&tree_d, frequencies_d.data, 2, frequencies_d.size, 15);
    if(error) break;

    numcodes_ll = tree_ll.numcodes; if(numcodes_ll > 286) numcodes_ll = 286;
    numcodes_d = tree_d.numcodes; if(numcodes_d > 30) numcodes_d = 30;
    /*store the code lengths of both generated trees in bitlen_lld*/
    for(i = 0; i != numcodes_ll; ++i) uivector_push_back(&bitlen_lld, HuffmanTree_getLength(&tree_ll, (unsigned)i));
    for(i = 0; i != numcodes_d; ++i) uivector_push_back(&bitlen_lld, HuffmanTree_getLength(&tree_d, (unsigned)i));

    /*run-length compress bitlen_ldd into bitlen_lld_e by using repeat codes 16 (copy length 3-6 times),
    17 (3-10 zeroes), 18 (11-138 zeroes)*/
    for(i = 0; i != (unsigned)bitlen_lld.size; ++i)
    {
      unsigned j = 0; /*amount of repititions*/
      while(i + j + 1 < (unsigned)bitlen_lld.size && bitlen_lld.data[i + j + 1] == bitlen_lld.data[i]) ++j;

      if(bitlen_lld.data[i] == 0 && j >= 2) /*repeat code for zeroes*/
      {
        ++j; /*include the first zero*/
        if(j <= 10) /*repeat code 17 supports max 10 zeroes*/
        {
          uivector_push_back(&bitlen_lld_e, 17);
          uivector_push_back(&bitlen_lld_e, j - 3);
        }
        else /*repeat code 18 supports max 138 zeroes*/
        {
          if(j > 138) j = 138;
          uivector_push_back(&bitlen_lld_e, 18);
          uivector_push_back(&bitlen_lld_e, j - 11);
        }
        i += (j - 1);
      }
      else if(j >= 3) /*repeat code for value other than zero*/
      {
        size_t k;
        unsigned num = j / 6, rest = j % 6;
        uivector_push_back(&bitlen_lld_e, bitlen_lld.data[i]);
        for(k = 0; k < num; ++k)
        {
          uivector_push_back(&bitlen_lld_e, 16);
          uivector_push_back(&bitlen_lld_e, 6 - 3);
        }
        if(rest >= 3)
        {
          uivector_push_back(&bitlen_lld_e, 16);
          uivector_push_back(&bitlen_lld_e, rest - 3);
        }
        else j -= rest;
        i += j;
      }
      else /*too short to benefit from repeat code*/
      {
        uivector_push_back(&bitlen_lld_e, bitlen_lld.data[i]);
      }
    }

    /*generate tree_cl, the huffmantree of huffmantrees*/

    if(!uivector_resizev(&frequencies_cl, NUM_CODE_LENGTH_CODES, 0)) ERROR_BREAK(83 /*alloc fail*/);
    for(i = 0; i != bitlen_lld_e.size; ++i)
    {
      ++frequencies_cl.data[bitlen_lld_e.data[i]];
      /*after a repeat code come the bits that specify the number of repetitions,
      those don't need to be in the frequencies_cl calculation*/
      if(bitlen_lld_e.data[i] >= 16) ++i;
    }

    error = HuffmanTree_makeFromFrequencies(&tree_cl, frequencies_cl.data,
                                            frequencies_cl.size, frequencies_cl.size, 7);
    if(error) break;

    if(!uivector_resize(&bitlen_cl, tree_cl.numcodes)) ERROR_BREAK(83 /*alloc fail*/);
    for(i = 0; i != tree_cl.numcodes; ++i)
    {
      /*lenghts of code length tree is in the order as specified by deflate*/
      bitlen_cl.data[i] = HuffmanTree_getLength(&tree_cl, CLCL_ORDER[i]);
    }
    while(bitlen_cl.data[bitlen_cl.size - 1] == 0 && bitlen_cl.size > 4)
    {
      /*remove zeros at the end, but minimum size must be 4*/
      if(!uivector_resize(&bitlen_cl, bitlen_cl.size - 1)) ERROR_BREAK(83 /*alloc fail*/);
    }
    if(error) break;

    /*
    Write everything into the output

    After the BFINAL and BTYPE, the dynamic block consists out of the following:
    - 5 bits HLIT, 5 bits HDIST, 4 bits HCLEN
    - (HCLEN+4)*3 bits code lengths of code length alphabet
    - HLIT + 257 code lenghts of lit/length alphabet (encoded using the code length
      alphabet, + possible repetition codes 16, 17, 18)
    - HDIST + 1 code lengths of distance alphabet (encoded using the code length
      alphabet, + possible repetition codes 16, 17, 18)
    - compressed data
    - 256 (end code)
    */

    /*Write block type*/
    addBitToStream(bp, out, BFINAL);
    addBitToStream(bp, out, 0); /*first bit of BTYPE "dynamic"*/
    addBitToStream(bp, out, 1); /*second bit of BTYPE "dynamic"*/

    /*write the HLIT, HDIST and HCLEN values*/
    HLIT = (unsigned)(numcodes_ll - 257);
    HDIST = (unsigned)(numcodes_d - 1);
    HCLEN = (unsigned)bitlen_cl.size - 4;
    /*trim zeroes for HCLEN. HLIT and HDIST were already trimmed at tree creation*/
    while(!bitlen_cl.data[HCLEN + 4 - 1] && HCLEN > 0) --HCLEN;
    addBitsToStream(bp, out, HLIT, 5);
    addBitsToStream(bp, out, HDIST, 5);
    addBitsToStream(bp, out, HCLEN, 4);

    /*write the code lenghts of the code length alphabet*/
    for(i = 0; i != HCLEN + 4; ++i) addBitsToStream(bp, out, bitlen_cl.data[i], 3);

    /*write the lenghts of the lit/len AND the dist alphabet*/
    for(i = 0; i != bitlen_lld_e.size; ++i)
    {
      addHuffmanSymbol(bp, out, HuffmanTree_getCode(&tree_cl, bitlen_lld_e.data[i]),
                       HuffmanTree_getLength(&tree_cl, bitlen_lld_e.data[i]));
      /*extra bits of repeat codes*/
      if(bitlen_lld_e.data[i] == 16) addBitsToStream(bp, out, bitlen_lld_e.data[++i], 2);
      else if(bitlen_lld_e.data[i] == 17) addBitsToStream(bp, out, bitlen_lld_e.data[++i], 3);
      else if(bitlen_lld_e.data[i] == 18) addBitsToStream(bp, out, bitlen_lld_e.data[++i], 7);
    }

    /*write the compressed data symbols*/
    writeLZ77data(bp, out, &lz77_encoded, &tree_ll, &tree_d);
    /*error: the length of the end code 256 must be larger than 0*/
    if(HuffmanTree_getLength(&tree_ll, 256) == 0) ERROR_BREAK(64);

    /*write the end code*/
    addHuffmanSymbol(bp, out, HuffmanTree_getCode(&tree_ll, 256), HuffmanTree_getLength(&tree_ll, 256));

    break; /*end of error-while*/
  }

  /*cleanup*/
  uivector_cleanup(&lz77_encoded);
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);
  HuffmanTree_cleanup(&tree_cl);
  uivector_cleanup(&frequencies_ll);
  uivector_cleanup(&frequencies_d);
  uivector_cleanup(&frequencies_cl);
  uivector_cleanup(&bitlen_lld_e);
  uivector_cleanup(&bitlen_lld);
  uivector_cleanup(&bitlen_cl);

  return error;
}